

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

bool dg::pta::PointerAnalysisFSInv::invStrongUpdate(PSNode *operand)

{
  bool bVar1;
  size_t sVar2;
  Pointer *ptr;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  PointerIdPointsToSet *in_stack_ffffffffffffffc0;
  Pointer local_28;
  Pointer *local_18;
  bool local_1;
  
  sVar2 = PointerIdPointsToSet::size((PointerIdPointsToSet *)0x17230a);
  if (sVar2 == 1) {
    PointerIdPointsToSet::begin(in_stack_ffffffffffffffc0);
    local_28 = PointerIdPointsToSet::const_iterator::operator*
                         ((const_iterator *)
                          CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    local_18 = &local_28;
    bVar1 = Offset::isUnknown(&local_28.offset);
    local_1 = false;
    if (!bVar1) {
      bVar1 = isInvalidTarget(local_18->target);
      local_1 = false;
      if (!bVar1) {
        local_1 = knownInstance((PSNode *)0x172390);
      }
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool invStrongUpdate(const PSNode *operand) {
        // If we are freeing memory through node that
        // points to precisely known valid memory that is not allocated
        // on a loop, we can do strong update.
        //
        // TODO: we can do strong update also on must-aliases
        // of the invalidated pointer. That is, e.g. for
        // free(p), we may do strong update for q if q is must-alias
        // of p (no matter the size of p's and q's points-to sets)
        if (operand->pointsTo.size() != 1)
            return false;

        const auto &ptr = *(operand->pointsTo.begin());
        return !ptr.offset.isUnknown() && !isInvalidTarget(ptr.target) &&
               knownInstance(ptr.target);
    }